

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTable
          (BinaryReaderInterp *this,Index index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  TableType local_e0;
  uint64_t local_b0;
  uint64_t local_a8;
  undefined8 local_a0;
  ValueType local_98;
  undefined1 local_90 [8];
  TableType table_type;
  Location local_58;
  Enum local_34;
  Limits *local_30;
  Limits *elem_limits_local;
  BinaryReaderInterp *pBStack_20;
  Index index_local;
  BinaryReaderInterp *this_local;
  Type elem_type_local;
  
  local_30 = elem_limits;
  elem_limits_local._4_4_ = index;
  pBStack_20 = this;
  unique0x100001fe = elem_type;
  GetLocation(&local_58,this);
  table_type.limits._16_8_ = stack0xffffffffffffffec;
  local_34 = (Enum)SharedValidator::OnTable
                             (&this->validator_,&local_58,stack0xffffffffffffffec,local_30);
  bVar2 = Failed((Result)local_34);
  if (bVar2) {
    Result::Result((Result *)&elem_type_local,Error);
  }
  else {
    local_98 = stack0xffffffffffffffec;
    local_b0 = local_30->initial;
    local_a8 = local_30->max;
    local_a0._0_1_ = local_30->has_max;
    local_a0._1_1_ = local_30->is_shared;
    local_a0._2_1_ = local_30->is_64;
    local_a0._3_5_ = *(undefined5 *)&local_30->field_0x13;
    TableType::TableType((TableType *)local_90,stack0xffffffffffffffec,*local_30);
    pMVar1 = this->module_;
    TableType::TableType(&local_e0,(TableType *)local_90);
    std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::push_back
              (&pMVar1->tables,(value_type *)&local_e0);
    TableDesc::~TableDesc((TableDesc *)&local_e0);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_90);
    Result::Result((Result *)&elem_type_local,Ok);
    TableType::~TableType((TableType *)local_90);
  }
  return (Result)elem_type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnTable(Index index,
                                   Type elem_type,
                                   const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(GetLocation(), elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.tables.push_back(TableDesc{table_type});
  table_types_.push_back(table_type);
  return Result::Ok;
}